

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O0

MatrixXd *
ear::anon_unknown_0::generatePanningPositionsResults
          (MatrixXd *__return_storage_ptr__,shared_ptr<ear::PointSourcePanner> *psp,
          Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *positions
          )

{
  element_type *peVar1;
  long lVar2;
  Index IVar3;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  ColXpr local_e8;
  ConstRowXpr local_a0;
  Matrix<double,3,1,0,3,1> local_68 [24];
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_50;
  int local_34;
  Index IStack_30;
  int i;
  int local_28;
  undefined1 local_21;
  Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *local_20;
  Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *positions_local;
  shared_ptr<ear::PointSourcePanner> *psp_local;
  MatrixXd *results;
  
  local_21 = 0;
  local_20 = positions;
  positions_local =
       (Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)psp;
  psp_local = (shared_ptr<ear::PointSourcePanner> *)__return_storage_ptr__;
  peVar1 = std::
           __shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)psp);
  local_28 = (*peVar1->_vptr_PointSourcePanner[1])();
  IStack_30 = Eigen::
              MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
              ::rows((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      *)local_20);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_28,
             &stack0xffffffffffffffd0);
  for (local_34 = 0; lVar2 = (long)local_34,
      IVar3 = Eigen::
              MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
              ::rows((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      *)local_20), lVar2 < IVar3; local_34 = local_34 + 1) {
    peVar1 = std::
             __shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)positions_local);
    Eigen::
    DenseBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
    ::row(&local_a0,
          (DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           *)local_20,(long)local_34);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>const,1,_1,false>>
              (local_68,(EigenBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>
                         *)&local_a0);
    (**peVar1->_vptr_PointSourcePanner)(&local_50,peVar1,local_68);
    other = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get(&local_50);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_e8,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
               (long)local_34);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_e8,other);
    boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd generatePanningPositionsResults(
        const std::shared_ptr<PointSourcePanner> &psp,
        const Eigen::Ref<const Eigen::MatrixXd> &positions) {
      Eigen::MatrixXd results(psp->numberOfOutputChannels(), positions.rows());
      for (int i = 0; i < positions.rows(); ++i) {
        results.col(i) = psp->handle(positions.row(i)).get();
      }
      return results;
    }